

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  parasail_result_t *ppVar24;
  undefined1 (*ptr) [16];
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m256i vMaxH;
  int32_t *local_2f8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  undefined1 local_260 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  int local_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  int local_c0;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_avx2_256_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_avx2_256_32_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_avx2_256_32_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_avx2_256_32_cold_4();
  }
  else {
    uVar45 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_table_diag_avx2_256_32_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_table_diag_avx2_256_32_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_table_diag_avx2_256_32_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar45 = (ulong)(uint)matrix->length;
      }
      iVar31 = matrix->min;
      uVar19 = 0x80000000 - iVar31;
      if (iVar31 != -open && SBORROW4(iVar31,-open) == iVar31 + open < 0) {
        uVar19 = open | 0x80000000;
      }
      iVar32 = uVar19 + 1;
      iVar31 = 0x7ffffffe - matrix->max;
      local_140._4_4_ = iVar32;
      local_140._0_4_ = iVar32;
      local_140._8_4_ = iVar32;
      local_140._12_4_ = iVar32;
      local_140._16_4_ = iVar32;
      local_140._20_4_ = iVar32;
      local_140._24_4_ = iVar32;
      local_140._28_4_ = iVar32;
      local_1e0._4_4_ = iVar32;
      local_1e0._0_4_ = iVar32;
      local_1e0._8_4_ = iVar32;
      local_1e0._12_4_ = iVar32;
      local_1e0._16_4_ = iVar32;
      local_1e0._20_4_ = iVar32;
      local_1e0._24_4_ = iVar32;
      local_1e0._28_4_ = iVar32;
      local_180._4_4_ = iVar32;
      local_180._0_4_ = iVar32;
      local_180._8_4_ = iVar32;
      local_180._12_4_ = iVar32;
      local_180._16_4_ = iVar32;
      local_180._20_4_ = iVar32;
      local_180._24_4_ = iVar32;
      local_180._28_4_ = iVar32;
      auVar49 = in_ZMM3._0_16_;
      uVar19 = (uint)uVar45;
      ppVar24 = parasail_result_new_table1(uVar19,s2Len);
      if (ppVar24 != (parasail_result_t *)0x0) {
        ppVar24->flag = ppVar24->flag | 0x8421004;
        uVar44 = (ulong)(s2Len + 0xe);
        ptr = (undefined1 (*) [16])parasail_memalign_int32_t(0x20,uVar44);
        ptr_00 = parasail_memalign_int32_t(0x20,uVar44);
        ptr_01 = parasail_memalign_int32_t(0x20,uVar44);
        if (ptr_01 != (int32_t *)0x0 &&
            (ptr_00 != (int32_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          if (matrix->type == 0) {
            iVar23 = uVar19 + 7;
            local_2f8 = parasail_memalign_int32_t(0x20,(long)iVar23);
            if (local_2f8 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar19) {
              piVar4 = matrix->mapper;
              uVar44 = 0;
              do {
                local_2f8[uVar44] = piVar4[(byte)_s1[uVar44]];
                uVar44 = uVar44 + 1;
              } while (uVar45 != uVar44);
            }
            iVar28 = uVar19 + 1;
            if ((int)(uVar19 + 1) < iVar23) {
              iVar28 = iVar23;
            }
            memset(local_2f8 + (int)uVar19,0,(ulong)(~uVar19 + iVar28) * 4 + 4);
          }
          else {
            local_2f8 = (int32_t *)0x0;
          }
          uVar20 = s2Len + 7;
          auVar50._4_4_ = iVar32;
          auVar50._0_4_ = iVar32;
          auVar50._8_4_ = iVar32;
          auVar50._12_4_ = iVar32;
          auVar50._16_4_ = iVar32;
          auVar50._20_4_ = iVar32;
          auVar50._24_4_ = iVar32;
          auVar50._28_4_ = iVar32;
          local_e0 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar50,0x7f);
          piVar4 = matrix->mapper;
          uVar44 = 1;
          if (1 < s2Len) {
            uVar44 = (ulong)(uint)s2Len;
          }
          uVar29 = 0;
          do {
            *(int *)(ptr[1] + uVar29 * 4 + 0xc) = piVar4[(byte)_s2[uVar29]];
            uVar29 = uVar29 + 1;
          } while (uVar44 != uVar29);
          *(undefined1 (*) [16])(*ptr + 0xc) = (undefined1  [16])0x0;
          *ptr = (undefined1  [16])0x0;
          uVar29 = (ulong)(uint)s2Len;
          uVar18 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar20) {
            uVar18 = uVar20;
          }
          uVar47 = 0;
          auVar50 = ZEXT1632(auVar49);
          local_160 = iVar31;
          iStack_15c = iVar31;
          iStack_158 = iVar31;
          iStack_154 = iVar31;
          iStack_150 = iVar31;
          iStack_14c = iVar31;
          iStack_148 = iVar31;
          iStack_144 = iVar31;
          local_100 = uVar19;
          uStack_fc = uVar19;
          uStack_f8 = uVar19;
          uStack_f4 = uVar19;
          uStack_f0 = uVar19;
          uStack_ec = uVar19;
          uStack_e8 = uVar19;
          uStack_e4 = uVar19;
          local_c0 = s2Len;
          iStack_bc = s2Len;
          iStack_b8 = s2Len;
          iStack_b4 = s2Len;
          iStack_b0 = s2Len;
          iStack_ac = s2Len;
          iStack_a8 = s2Len;
          iStack_a4 = s2Len;
          local_a0 = gap;
          iStack_9c = gap;
          iStack_98 = gap;
          iStack_94 = gap;
          iStack_90 = gap;
          iStack_8c = gap;
          iStack_88 = gap;
          iStack_84 = gap;
          local_80 = open;
          iStack_7c = open;
          iStack_78 = open;
          iStack_74 = open;
          iStack_70 = open;
          iStack_6c = open;
          iStack_68 = open;
          iStack_64 = open;
          memset(ptr[1] + uVar29 * 4 + 0xc,0,(ulong)(~s2Len + uVar18) * 4 + 4);
          do {
            ptr_00[uVar47 + 7] = 0;
            ptr_01[uVar47 + 7] = iVar32;
            uVar47 = uVar47 + 1;
          } while (uVar44 != uVar47);
          lVar25 = 0;
          do {
            ptr_00[lVar25] = iVar32;
            ptr_01[lVar25] = iVar32;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 7);
          lVar25 = uVar29 + 7;
          do {
            ptr_00[lVar25] = iVar32;
            ptr_01[lVar25] = iVar32;
            lVar25 = lVar25 + 1;
            s2Len = s2Len + 1;
          } while (s2Len < (int)uVar20);
          auVar48 = ZEXT3264(local_1e0);
          if ((int)uVar19 < 1) {
            local_1a0._4_4_ = iVar32;
            local_1a0._0_4_ = iVar32;
            local_1a0._12_4_ = iVar32;
            local_1a0._8_4_ = iVar32;
            local_1a0._20_4_ = iVar32;
            local_1a0._16_4_ = iVar32;
            local_1a0._28_4_ = iVar32;
            local_1a0._24_4_ = iVar32;
            local_1c0._4_4_ = iStack_15c;
            local_1c0._0_4_ = local_160;
            local_1c0._12_4_ = iStack_154;
            local_1c0._8_4_ = iStack_158;
            local_1c0._20_4_ = iStack_14c;
            local_1c0._16_4_ = iStack_150;
            local_1c0._28_4_ = iStack_144;
            local_1c0._24_4_ = iStack_148;
          }
          else {
            piVar4 = matrix->matrix;
            uVar19 = uVar19 - 1;
            uVar44 = 1;
            if (1 < (int)uVar20) {
              uVar44 = (ulong)uVar20;
            }
            lVar25 = uVar29 * 0x20;
            local_268 = uVar29 * 4 + -4;
            local_278 = uVar29 * 0x1c + -0x1c;
            local_280 = uVar29 * 0x18 + -0x18;
            local_288 = uVar29 * 0x14 + -0x14;
            local_290 = uVar29 * 8 + -8;
            local_298 = uVar29 * 0x10 + -0x10;
            local_2a0 = uVar29 * 0xc + -0xc;
            local_260._8_8_ = 0x400000005;
            local_260._0_8_ = 0x600000007;
            local_260._16_8_ = 0x200000003;
            local_260._24_8_ = 1;
            local_270 = 0;
            auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
            auVar51 = ZEXT3264(auVar50);
            local_120 = 8;
            uStack_11c = 8;
            uStack_118 = 8;
            uStack_114 = 8;
            uStack_110 = 8;
            uStack_10c = 8;
            uStack_108 = 8;
            uStack_104 = 8;
            local_1c0._4_4_ = iStack_15c;
            local_1c0._0_4_ = local_160;
            local_1c0._12_4_ = iStack_154;
            local_1c0._8_4_ = iStack_158;
            local_1c0._20_4_ = iStack_14c;
            local_1c0._16_4_ = iStack_150;
            local_1c0._28_4_ = iStack_144;
            local_1c0._24_4_ = iStack_148;
            local_1a0._4_4_ = iVar32;
            local_1a0._0_4_ = iVar32;
            local_1a0._12_4_ = iVar32;
            local_1a0._8_4_ = iVar32;
            local_1a0._20_4_ = iVar32;
            local_1a0._16_4_ = iVar32;
            local_1a0._28_4_ = iVar32;
            local_1a0._24_4_ = iVar32;
            uVar47 = 0;
            do {
              iVar31 = matrix->type;
              uVar18 = (uint)uVar47;
              uVar20 = uVar18;
              if (iVar31 == 0) {
                uVar20 = local_2f8[uVar47];
              }
              uVar37 = uVar47 | 1;
              if (iVar31 == 0) {
                uVar46 = local_2f8[uVar37];
              }
              else {
                uVar46 = uVar19;
                if (uVar37 < uVar45) {
                  uVar46 = uVar18 | 1;
                }
              }
              uVar39 = uVar47 | 2;
              if (iVar31 == 0) {
                uVar36 = local_2f8[uVar39];
              }
              else {
                uVar36 = uVar19;
                if (uVar39 < uVar45) {
                  uVar36 = uVar18 | 2;
                }
              }
              uVar40 = uVar47 | 3;
              if (iVar31 == 0) {
                uVar43 = local_2f8[uVar40];
              }
              else {
                uVar43 = uVar19;
                if (uVar40 < uVar45) {
                  uVar43 = uVar18 | 3;
                }
              }
              uVar41 = uVar47 | 4;
              if (iVar31 == 0) {
                uVar33 = local_2f8[uVar41];
              }
              else {
                uVar33 = uVar19;
                if (uVar41 < uVar45) {
                  uVar33 = uVar18 | 4;
                }
              }
              uVar42 = uVar47 | 5;
              if (iVar31 == 0) {
                uVar38 = local_2f8[uVar42];
              }
              else {
                uVar38 = uVar19;
                if (uVar42 < uVar45) {
                  uVar38 = uVar18 | 5;
                }
              }
              uVar34 = uVar47 | 6;
              if (iVar31 == 0) {
                uVar21 = local_2f8[uVar34];
              }
              else {
                uVar21 = uVar19;
                if (uVar34 < uVar45) {
                  uVar21 = uVar18 | 6;
                }
              }
              iVar23 = matrix->size;
              uVar35 = uVar47 | 7;
              if (iVar31 == 0) {
                uVar30 = local_2f8[uVar35];
              }
              else {
                uVar30 = uVar19;
                if (uVar35 < uVar45) {
                  uVar30 = uVar18 | 7;
                }
              }
              auVar13._4_4_ = uStack_fc;
              auVar13._0_4_ = local_100;
              auVar13._8_4_ = uStack_f8;
              auVar13._12_4_ = uStack_f4;
              auVar13._16_4_ = uStack_f0;
              auVar13._20_4_ = uStack_ec;
              auVar13._24_4_ = uStack_e8;
              auVar13._28_4_ = uStack_e4;
              auVar10 = vpcmpgtd_avx2(auVar13,local_260);
              uVar26 = 0;
              auVar12 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
              auVar15._4_4_ = iVar32;
              auVar15._0_4_ = iVar32;
              auVar15._8_4_ = iVar32;
              auVar15._12_4_ = iVar32;
              auVar15._16_4_ = iVar32;
              auVar15._20_4_ = iVar32;
              auVar15._24_4_ = iVar32;
              auVar15._28_4_ = iVar32;
              auVar13 = local_e0;
              auVar54 = local_e0;
              auVar50 = auVar15;
              do {
                auVar49 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar43 * iVar23) +
                                                           (long)*(int *)(ptr[1] + uVar26 * 4)]),
                                      piVar4[(long)(int)(uVar36 * iVar23) +
                                             (long)*(int *)(ptr[1] + uVar26 * 4 + 4)],1);
                auVar49 = vpinsrd_avx(auVar49,piVar4[(long)(int)(uVar46 * iVar23) +
                                                     (long)*(int *)(ptr[1] + uVar26 * 4 + 8)],2);
                auVar49 = vpinsrd_avx(auVar49,piVar4[(long)(int)(uVar20 * iVar23) +
                                                     (long)*(int *)(ptr[1] + uVar26 * 4 + 0xc)],3);
                auVar8 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar30 * iVar23) +
                                                          (long)*(int *)(*ptr + uVar26 * 4)]),
                                     piVar4[(long)(int)(uVar21 * iVar23) +
                                            (long)*(int *)(*ptr + uVar26 * 4 + 4)],1);
                auVar8 = vpinsrd_avx(auVar8,piVar4[(long)(int)(uVar38 * iVar23) +
                                                   (long)*(int *)(*ptr + uVar26 * 4 + 8)],2);
                auVar8 = vpinsrd_avx(auVar8,piVar4[(long)(int)(uVar33 * iVar23) +
                                                   (long)*(int *)(*ptr + uVar26 * 4 + 0xc)],3);
                auVar53._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar8;
                auVar53._16_16_ = ZEXT116(1) * auVar49;
                auVar55 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
                auVar14 = vpermd_avx2(auVar55,auVar13);
                auVar53 = vpaddd_avx2(auVar53,auVar54);
                iVar1 = ptr_00[uVar26 + 7];
                auVar54._4_4_ = iVar1;
                auVar54._0_4_ = iVar1;
                auVar54._8_4_ = iVar1;
                auVar54._12_4_ = iVar1;
                auVar54._16_4_ = iVar1;
                auVar54._20_4_ = iVar1;
                auVar54._24_4_ = iVar1;
                auVar54._28_4_ = iVar1;
                auVar54 = vpblendd_avx2(auVar14,auVar54,0x80);
                auVar15 = vpermd_avx2(auVar55,auVar15);
                iVar1 = ptr_01[uVar26 + 7];
                auVar55._4_4_ = iVar1;
                auVar55._0_4_ = iVar1;
                auVar55._8_4_ = iVar1;
                auVar55._12_4_ = iVar1;
                auVar55._16_4_ = iVar1;
                auVar55._20_4_ = iVar1;
                auVar55._24_4_ = iVar1;
                auVar55._28_4_ = iVar1;
                auVar55 = vpblendd_avx2(auVar15,auVar55,0x80);
                auVar52._4_4_ = iStack_7c;
                auVar52._0_4_ = local_80;
                auVar52._8_4_ = iStack_78;
                auVar52._12_4_ = iStack_74;
                auVar52._16_4_ = iStack_70;
                auVar52._20_4_ = iStack_6c;
                auVar52._24_4_ = iStack_68;
                auVar52._28_4_ = iStack_64;
                auVar15 = vpsubd_avx2(auVar54,auVar52);
                auVar14._4_4_ = iStack_9c;
                auVar14._0_4_ = local_a0;
                auVar14._8_4_ = iStack_98;
                auVar14._12_4_ = iStack_94;
                auVar14._16_4_ = iStack_90;
                auVar14._20_4_ = iStack_8c;
                auVar14._24_4_ = iStack_88;
                auVar14._28_4_ = iStack_84;
                auVar55 = vpsubd_avx2(auVar55,auVar14);
                auVar15 = vpmaxsd_avx2(auVar15,auVar55);
                auVar13 = vpsubd_avx2(auVar13,auVar52);
                auVar50 = vpsubd_avx2(auVar50,auVar14);
                auVar55 = vpmaxsd_avx2(auVar13,auVar50);
                auVar50 = vpmaxsd_avx2(auVar55,auVar15);
                auVar50 = vpmaxsd_avx2(auVar50,_DAT_008d4700);
                auVar53 = vpmaxsd_avx2(auVar53,auVar50);
                auVar50 = vpcmpeqd_avx2(auVar12,auVar51._0_32_);
                auVar13 = vpandn_avx2(auVar50,auVar53);
                if (7 < uVar26) {
                  local_1c0 = vpminsd_avx2(local_1c0,auVar13);
                  local_1a0 = vpmaxsd_avx2(local_1a0,auVar13);
                }
                piVar5 = ((ppVar24->field_4).rowcols)->score_row;
                if (uVar26 < uVar29) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_270) = auVar13._28_4_;
                }
                if (uVar26 - 1 < uVar29 && uVar37 < uVar45) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_268) = auVar13._24_4_;
                }
                if ((uVar39 < uVar45) && ((long)(uVar26 - 2) < (long)uVar29 && 1 < uVar26)) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_290) = auVar13._20_4_;
                }
                if ((uVar40 < uVar45) && ((long)(uVar26 - 3) < (long)uVar29 && 2 < uVar26)) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_2a0) = auVar13._16_4_;
                }
                if ((uVar41 < uVar45) && ((long)(uVar26 - 4) < (long)uVar29 && 3 < uVar26)) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_298) = auVar13._12_4_;
                }
                if ((uVar42 < uVar45) && ((long)(uVar26 - 5) < (long)uVar29 && 4 < uVar26)) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_288) = auVar13._8_4_;
                }
                if ((uVar34 < uVar45) && ((long)(uVar26 - 6) < (long)uVar29 && 5 < uVar26)) {
                  *(int *)((long)piVar5 + uVar26 * 4 + local_280) = auVar13._4_4_;
                }
                auVar9._4_4_ = iVar32;
                auVar9._0_4_ = iVar32;
                auVar9._8_4_ = iVar32;
                auVar9._12_4_ = iVar32;
                auVar9._16_4_ = iVar32;
                auVar9._20_4_ = iVar32;
                auVar9._24_4_ = iVar32;
                auVar9._28_4_ = iVar32;
                auVar15 = vblendvps_avx(auVar15,auVar9,auVar50);
                if ((uVar35 < uVar45) && ((long)(uVar26 - 7) < (long)uVar29 && 6 < uVar26)) {
                  *(int32_t *)((long)piVar5 + uVar26 * 4 + local_278) = auVar13._0_4_;
                }
                ptr_00[uVar26] = auVar13._0_4_;
                ptr_01[uVar26] = auVar15._0_4_;
                auVar11._4_4_ = iStack_bc;
                auVar11._0_4_ = local_c0;
                auVar11._8_4_ = iStack_b8;
                auVar11._12_4_ = iStack_b4;
                auVar11._16_4_ = iStack_b0;
                auVar11._20_4_ = iStack_ac;
                auVar11._24_4_ = iStack_a8;
                auVar11._28_4_ = iStack_a4;
                auVar14 = vpcmpgtd_avx2(auVar11,auVar12);
                auVar14 = vpand_avx2(auVar14,auVar10);
                auVar52 = vpsrad_avx2(auVar12,0x1f);
                auVar52 = vpandn_avx2(auVar52,auVar14);
                auVar49 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
                auVar9 = vpcmpeqd_avx2(auVar13,local_140);
                auVar11 = vpcmpgtd_avx2(auVar13,local_140);
                auVar14 = vpand_avx2(auVar11,auVar52);
                auVar8 = vpackssdw_avx(auVar14._0_16_,auVar14._16_16_);
                local_140 = vblendvps_avx(local_140,auVar53,auVar14);
                auVar53 = vpcmpgtd_avx2(local_180,auVar12);
                auVar53 = vpand_avx2(auVar53,auVar9);
                auVar7 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
                auVar49 = vpblendvb_avx(auVar8,auVar49,auVar7);
                auVar16._4_4_ = iVar32;
                auVar16._0_4_ = iVar32;
                auVar16._8_4_ = iVar32;
                auVar16._12_4_ = iVar32;
                auVar16._16_4_ = iVar32;
                auVar16._20_4_ = iVar32;
                auVar16._24_4_ = iVar32;
                auVar16._28_4_ = iVar32;
                auVar50 = vblendvps_avx(auVar55,auVar16,auVar50);
                auVar55 = vpmovsxwd_avx2(auVar49);
                local_1e0 = vblendvps_avx(auVar48._0_32_,local_260,auVar55);
                auVar48 = ZEXT3264(local_1e0);
                auVar53 = vpor_avx2(auVar53,auVar11);
                auVar53 = vpand_avx2(auVar52,auVar53);
                local_180 = vblendvps_avx(local_180,auVar12,auVar53);
                auVar53 = vpcmpeqd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar49));
                auVar51 = ZEXT3264(auVar53);
                auVar12 = vpsubd_avx2(auVar12,auVar53);
                uVar26 = uVar26 + 1;
              } while (uVar44 != uVar26);
              auVar10._8_4_ = 8;
              auVar10._0_8_ = 0x800000008;
              auVar10._12_4_ = 8;
              auVar10._16_4_ = 8;
              auVar10._20_4_ = 8;
              auVar10._24_4_ = 8;
              auVar10._28_4_ = 8;
              local_260 = vpaddd_avx2(local_260,auVar10);
              uVar47 = uVar47 + 8;
              local_270 = local_270 + lVar25;
              local_268 = local_268 + lVar25;
              local_278 = local_278 + lVar25;
              local_280 = local_280 + lVar25;
              local_288 = local_288 + lVar25;
              local_298 = local_298 + lVar25;
              local_2a0 = local_2a0 + lVar25;
              local_290 = local_290 + lVar25;
            } while (uVar47 < uVar45);
          }
          lVar25 = 0;
          iVar22 = 0;
          iVar23 = 0;
          iVar27 = 0;
          iVar28 = 0;
          iVar31 = iVar32;
          do {
            iVar2 = *(int *)(local_140 + lVar25 * 4);
            if (iVar31 < iVar2) {
              iVar31 = iVar2;
              iVar23 = *(int *)(local_1e0 + lVar25 * 4);
              iVar28 = *(int *)(local_180 + lVar25 * 4);
              iVar27 = *(int *)(local_180 + lVar25 * 4);
              iVar22 = *(int *)(local_1e0 + lVar25 * 4);
            }
            else if (iVar2 == iVar31) {
              iVar2 = *(int *)(local_180 + lVar25 * 4);
              if (iVar2 < iVar28) {
                iVar23 = *(int *)(local_1e0 + lVar25 * 4);
                iVar28 = iVar2;
                iVar27 = iVar2;
                iVar22 = *(int *)(local_1e0 + lVar25 * 4);
              }
              else if ((iVar2 == iVar28) &&
                      (iVar3 = *(int *)(local_1e0 + lVar25 * 4), bVar6 = iVar3 < iVar23,
                      iVar23 = iVar22, iVar28 = iVar27, bVar6)) {
                iVar23 = iVar3;
                iVar28 = iVar2;
                iVar27 = iVar2;
                iVar22 = iVar3;
              }
            }
            lVar25 = lVar25 + 1;
          } while ((int)lVar25 != 8);
          auVar12._4_4_ = iVar32;
          auVar12._0_4_ = iVar32;
          auVar12._8_4_ = iVar32;
          auVar12._12_4_ = iVar32;
          auVar12._16_4_ = iVar32;
          auVar12._20_4_ = iVar32;
          auVar12._24_4_ = iVar32;
          auVar12._28_4_ = iVar32;
          auVar50 = vpcmpgtd_avx2(auVar12,local_1c0);
          auVar17._4_4_ = iStack_15c;
          auVar17._0_4_ = local_160;
          auVar17._8_4_ = iStack_158;
          auVar17._12_4_ = iStack_154;
          auVar17._16_4_ = iStack_150;
          auVar17._20_4_ = iStack_14c;
          auVar17._24_4_ = iStack_148;
          auVar17._28_4_ = iStack_144;
          auVar15 = vpcmpgtd_avx2(local_1a0,auVar17);
          auVar50 = vpor_avx2(auVar50,auVar15);
          if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar50 >> 0x7f,0) != '\0') ||
                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0xbf,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar50[0x1f] < '\0') {
            *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
            iVar31 = 0;
            iVar28 = 0;
            iVar23 = 0;
          }
          ppVar24->score = iVar31;
          ppVar24->end_query = iVar23;
          ppVar24->end_ref = iVar28;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_2f8);
            return ppVar24;
          }
          return ppVar24;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vZero = _mm256_set1_epi32(0);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vJLimit = _mm256_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            vWH = _mm256_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi32(vJ, vNegOne),
                        _mm256_cmplt_epi32_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi32(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi32(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi32_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}